

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

int __thiscall
libtorrent::aux::session_impl::listen_port(session_impl *this,transport ssl,address *param_2)

{
  ushort uVar1;
  element_type *peVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  session_impl *psVar6;
  long lVar7;
  pointer psVar8;
  pointer psVar9;
  _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
  local_41;
  session_impl *local_40;
  pointer local_38;
  
  psVar9 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->m_listen_sockets).
             super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)local_38 - (long)psVar9;
  local_41 = (_Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
              )ssl;
  local_40 = this;
  if (0 < lVar5 >> 6) {
    lVar7 = (lVar5 >> 6) + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
              ::operator()(&local_41,
                           (__normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                            )param_2);
      psVar6 = local_40;
      psVar8 = psVar9;
      if (bVar3) goto LAB_002ca7b2;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
              ::operator()(&local_41,
                           (__normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                            )param_2);
      psVar6 = local_40;
      psVar8 = psVar9 + 1;
      if (bVar3) goto LAB_002ca7b2;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
              ::operator()(&local_41,
                           (__normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                            )param_2);
      psVar6 = local_40;
      psVar8 = psVar9 + 2;
      if (bVar3) goto LAB_002ca7b2;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
              ::operator()(&local_41,
                           (__normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                            )param_2);
      psVar6 = local_40;
      psVar8 = psVar9 + 3;
      if (bVar3) goto LAB_002ca7b2;
      psVar9 = psVar9 + 4;
      lVar7 = lVar7 + -1;
      lVar5 = lVar5 + -0x40;
    } while (1 < lVar7);
  }
  lVar5 = lVar5 >> 4;
  psVar6 = local_40;
  if (lVar5 != 1) {
    psVar8 = psVar9;
    if (lVar5 != 2) {
      psVar8 = local_38;
      if ((lVar5 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
                  ::operator()(&local_41,
                               (__normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                )param_2), psVar6 = local_40, psVar8 = psVar9, bVar3))
      goto LAB_002ca7b2;
      psVar8 = psVar9 + 1;
    }
    psVar6 = local_40;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
            ::operator()(&local_41,
                         (__normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                          )param_2);
    if (bVar3) goto LAB_002ca7b2;
    psVar9 = psVar8 + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
          ::operator()(&local_41,
                       (__normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                        )param_2);
  psVar8 = local_38;
  if (bVar3) {
    psVar8 = psVar9;
  }
LAB_002ca7b2:
  if (psVar8 == (psVar6->m_listen_sockets).
                super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    uVar4 = 0;
  }
  else {
    peVar2 = (psVar8->
             super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar4 = (peVar2->tcp_port_mapping).super_array<libtorrent::aux::listen_port_mapping,_2UL>.
            _M_elems[0].port;
    if ((uVar4 == 0) &&
       (uVar4 = (peVar2->tcp_port_mapping).super_array<libtorrent::aux::listen_port_mapping,_2UL>.
                _M_elems[1].port, uVar4 == 0)) {
      uVar1 = (peVar2->local_endpoint).impl_.data_.v4.sin_port;
      uVar4 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
    }
  }
  return uVar4;
}

Assistant:

int session_impl::listen_port(transport const ssl, address const& local_addr) const
	{
		auto socket = std::find_if(m_listen_sockets.begin(), m_listen_sockets.end()
			, [&](std::shared_ptr<listen_socket_t> const& e)
		{
			if (!(e->flags & listen_socket_t::accept_incoming)) return false;
			auto const& listen_addr = e->external_address.external_address();
			return e->ssl == ssl
				&& (listen_addr == local_addr
					|| (listen_addr.is_v4() == local_addr.is_v4() && listen_addr.is_unspecified()));
		});
		if (socket != m_listen_sockets.end())
			return (*socket)->tcp_external_port();
		return 0;
	}